

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

uint32_t roaring_bitmap_minimum(roaring_bitmap_t *bm)

{
  uint16_t uVar1;
  uint16_t uVar2;
  uint32_t lowvalue;
  uint32_t key;
  uint8_t type;
  container_t *c;
  roaring_bitmap_t *bm_local;
  
  if ((bm->high_low_container).size < 1) {
    bm_local._4_4_ = 0xffffffff;
  }
  else {
    uVar1 = *(bm->high_low_container).keys;
    uVar2 = container_minimum(*(bm->high_low_container).containers,
                              *(bm->high_low_container).typecodes);
    bm_local._4_4_ = CONCAT22(uVar1,uVar2);
  }
  return bm_local._4_4_;
}

Assistant:

uint32_t roaring_bitmap_minimum(const roaring_bitmap_t *bm) {
    if (bm->high_low_container.size > 0) {
        container_t *c = bm->high_low_container.containers[0];
        uint8_t type = bm->high_low_container.typecodes[0];
        uint32_t key = bm->high_low_container.keys[0];
        uint32_t lowvalue = container_minimum(c, type);
        return lowvalue | (key << 16);
    }
    return UINT32_MAX;
}